

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef kfold_xload(jit_State *J,IRIns *ir,void *p)

{
  TRef TVar1;
  cTValue *tv;
  IROp op;
  uint k;
  
  switch((uint)ir & 0x1f) {
  case 0xe:
    tv = lj_ir_k64_find(J,*p);
    op = IR_KNUM;
    goto LAB_0012c941;
  case 0xf:
    k = (uint)*p;
    break;
  case 0x10:
    k = (uint)*p;
    break;
  case 0x11:
    k = (uint)*p;
    break;
  case 0x12:
    k = (uint)*p;
    break;
  case 0x13:
  case 0x14:
    k = *p;
    break;
  case 0x15:
  case 0x16:
    tv = lj_ir_k64_find(J,*p);
    op = IR_KINT64;
LAB_0012c941:
    TVar1 = lj_ir_k64(J,op,tv);
    return TVar1;
  default:
    return 0;
  }
  TVar1 = lj_ir_kint(J,k);
  return TVar1;
}

Assistant:

static TRef kfold_xload(jit_State *J, IRIns *ir, const void *p)
{
  int32_t k;
  switch (irt_type(ir->t)) {
  case IRT_NUM: return lj_ir_knum_u64(J, *(uint64_t *)p);
  case IRT_I8: k = (int32_t)*(int8_t *)p; break;
  case IRT_U8: k = (int32_t)*(uint8_t *)p; break;
  case IRT_I16: k = (int32_t)(int16_t)lj_getu16(p); break;
  case IRT_U16: k = (int32_t)(uint16_t)lj_getu16(p); break;
  case IRT_INT: case IRT_U32: k = (int32_t)lj_getu32(p); break;
  case IRT_I64: case IRT_U64: return lj_ir_kint64(J, *(uint64_t *)p);
  default: return 0;
  }
  return lj_ir_kint(J, k);
}